

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassFactoryRegistry.cpp
# Opt level: O0

void __thiscall
Lodtalk::ClassFactoryRegistry::registerVMContext(ClassFactoryRegistry *this,VMContext *context)

{
  bool bVar1;
  reference ppAVar2;
  AbstractClassFactory *factory;
  iterator __end1;
  iterator __begin1;
  Factories *__range1;
  VMContext *context_local;
  ClassFactoryRegistry *this_local;
  
  __end1 = std::
           unordered_set<Lodtalk::AbstractClassFactory_*,_std::hash<Lodtalk::AbstractClassFactory_*>,_std::equal_to<Lodtalk::AbstractClassFactory_*>,_std::allocator<Lodtalk::AbstractClassFactory_*>_>
           ::begin(&this->factories);
  factory = (AbstractClassFactory *)
            std::
            unordered_set<Lodtalk::AbstractClassFactory_*,_std::hash<Lodtalk::AbstractClassFactory_*>,_std::equal_to<Lodtalk::AbstractClassFactory_*>,_std::allocator<Lodtalk::AbstractClassFactory_*>_>
            ::end(&this->factories);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<Lodtalk::AbstractClassFactory_*,_false>,
                       (_Node_iterator_base<Lodtalk::AbstractClassFactory_*,_false> *)&factory);
    if (!bVar1) break;
    ppAVar2 = std::__detail::_Node_iterator<Lodtalk::AbstractClassFactory_*,_true,_false>::operator*
                        (&__end1);
    VMContext::instanceClassFactory(context,*ppAVar2);
    std::__detail::_Node_iterator<Lodtalk::AbstractClassFactory_*,_true,_false>::operator++(&__end1)
    ;
  }
  return;
}

Assistant:

void ClassFactoryRegistry::registerVMContext(VMContext *context)
{
    for (auto factory : factories)
        context->instanceClassFactory(factory);
}